

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsTTDReStartTimeTravelAfterRuntimeOperation(void)

{
  EventLog *this;
  JsrtContext *pJVar1;
  
  pJVar1 = JsrtContext::GetCurrent();
  if (pJVar1 != (JsrtContext *)0x0) {
    this = ((((pJVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
           threadContext->TTDLog;
    if (this != (EventLog *)0x0) {
      TTD::EventLog::PopMode(this,ExcludedExecutionDebuggerAction);
    }
    return JsNoError;
  }
  TTDAbort_unrecoverable_error("Must have valid context when changing debugger mode.");
}

Assistant:

CHAKRA_API JsTTDReStartTimeTravelAfterRuntimeOperation()
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsrtContext *currentContext = JsrtContext::GetCurrent();
    JsErrorCode cCheck = CheckContext(currentContext, JSRT_MAYBE_TRUE);
    TTDAssert(cCheck == JsNoError, "Must have valid context when changing debugger mode.");

    Js::ScriptContext* scriptContext = currentContext->GetScriptContext();
    ThreadContext* threadContext = scriptContext->GetThreadContext();

    if(threadContext->IsRuntimeInTTDMode())
    {
        threadContext->TTDLog->PopMode(TTD::TTDMode::ExcludedExecutionDebuggerAction);
    }

    return JsNoError;
#endif
}